

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void AM_showSS(void)

{
  FPolyNode *pFVar1;
  FPolyNode **ppFVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  subsector_t *psVar5;
  int i_1;
  long lVar6;
  AMColor red;
  AMColor yellow;
  AMColor local_40;
  AMColor local_38;
  
  if ((-1 < am_showsubsector.Value) && (am_showsubsector.Value < numsubsectors)) {
    lVar6 = 0;
    AMColor::FromRGB(&local_38,0xff,0xff,0);
    AMColor::FromRGB(&local_40,0xff,0,0);
    psVar5 = subsectors + am_showsubsector.Value;
    for (uVar3 = 0; uVar3 < psVar5->numlines; uVar3 = uVar3 + 1) {
      AM_drawSeg((seg_t *)((long)&psVar5->firstline->v1 + lVar6),&local_38);
      lVar6 = lVar6 + 0x30;
    }
    PO_LinkToSubsectors();
    for (lVar6 = 0; lVar6 < po_NumPolyobjs; lVar6 = lVar6 + 1) {
      ppFVar2 = &polyobjs[lVar6].subsectorlinks;
      while (pFVar1 = *ppFVar2, pFVar1 != (FPolyNode *)0x0) {
        if (pFVar1->subsector == psVar5) {
          lVar4 = 0;
          for (uVar3 = 0; uVar3 < (pFVar1->segs).Count; uVar3 = uVar3 + 1) {
            AM_drawPolySeg((FPolySeg *)((long)&(((pFVar1->segs).Array)->v1).pos.X + lVar4),&local_40
                          );
            lVar4 = lVar4 + 0x28;
          }
        }
        ppFVar2 = &pFVar1->snext;
      }
    }
  }
  return;
}

Assistant:

inline operator int () const { return Value; }